

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckerboardPatternOfAsterisks.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  for (uVar1 = 1; uVar1 != 9; uVar1 = uVar1 + 1) {
    if ((uVar1 & 1) == 0) {
      putchar(0x20);
    }
    iVar2 = 8;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      printf("%s","* ");
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int main (void) {
    int externalCounter = 1;
    int internalCounter = 1;

    while (externalCounter <= 8) {
        if (externalCounter % 2 == 0) {
            printf("%s", " ");

        }
        while (internalCounter <= 8) {
            printf("%s", "* ");
            internalCounter++;

        }
        puts("");
        externalCounter++;
        internalCounter = 1;

    }

    return 0;

}